

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O2

void __thiscall
Assimp::AMFImporter::Postprocess_BuildNodeAndObject
          (AMFImporter *this,CAMFImporter_NodeElement_Object *pNodeElement,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pMeshList,aiNode **pSceneNode)

{
  EType EVar1;
  ulong __n;
  CAMFImporter_NodeElement_Color *pNodeElement_00;
  aiNode *this_00;
  CAMFImporter_NodeElement_Color *pObjectColor;
  aiNode *this_01;
  CAMFImporter_NodeElement_Color *pCVar2;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *plVar3;
  _List_node_base *p_Var4;
  vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
  color_arr;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertex_arr;
  _Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
  local_68;
  ai_uint32 local_48;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  
  this_00 = (aiNode *)operator_new(0x478);
  this_01 = this_00;
  aiNode::aiNode(this_00);
  *pSceneNode = this_00;
  __n = (pNodeElement->super_CAMFImporter_NodeElement).ID._M_string_length;
  if (__n < 0x400) {
    (this_00->mName).length = (ai_uint32)__n;
    this_01 = (aiNode *)(this_00->mName).data;
    memcpy(this_01,(pNodeElement->super_CAMFImporter_NodeElement).ID._M_dataplus._M_p,__n);
    (this_00->mName).data[__n] = '\0';
  }
  plVar3 = &(pNodeElement->super_CAMFImporter_NodeElement).Child;
  pObjectColor = (CAMFImporter_NodeElement_Color *)0x0;
  p_Var4 = (_List_node_base *)plVar3;
  while (p_Var4 = (((_List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar3) {
    pNodeElement_00 = (CAMFImporter_NodeElement_Color *)p_Var4[1]._M_next;
    local_38 = '\0';
    cStack_37 = '\0';
    cStack_36 = '\0';
    cStack_35 = '\0';
    cStack_34 = '\0';
    cStack_33 = '\0';
    cStack_32 = '\0';
    cStack_31 = '\0';
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48 = 0;
    cStack_44 = '\0';
    cStack_43 = '\0';
    cStack_42 = '\0';
    cStack_41 = '\0';
    cStack_40 = '\0';
    cStack_3f = '\0';
    cStack_3e = '\0';
    cStack_3d = '\0';
    cStack_3c = '\0';
    cStack_3b = '\0';
    cStack_3a = '\0';
    cStack_39 = '\0';
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    EVar1 = (pNodeElement_00->super_CAMFImporter_NodeElement).Type;
    pCVar2 = pObjectColor;
    if (EVar1 == ENET_Color) {
      pCVar2 = pNodeElement_00;
    }
    if (EVar1 == ENET_Mesh) {
      PostprocessHelper_CreateMeshDataArray
                ((AMFImporter *)this_01,(CAMFImporter_NodeElement_Mesh *)pNodeElement_00,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 &stack0xffffffffffffffb8,
                 (vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                  *)&local_68);
      Postprocess_BuildMeshSet
                (this,(CAMFImporter_NodeElement_Mesh *)pNodeElement_00,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 &stack0xffffffffffffffb8,
                 (vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                  *)&local_68,pObjectColor,pMeshList,*pSceneNode);
    }
    std::
    _Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
    ::~_Vector_base(&local_68);
    this_01 = (aiNode *)&stack0xffffffffffffffb8;
    std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
              ((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &stack0xffffffffffffffb8);
    pObjectColor = pCVar2;
  }
  return;
}

Assistant:

void AMFImporter::Postprocess_BuildNodeAndObject(const CAMFImporter_NodeElement_Object& pNodeElement, std::list<aiMesh*>& pMeshList, aiNode** pSceneNode)
{
CAMFImporter_NodeElement_Color* object_color = nullptr;

	// create new aiNode and set name as <object> has.
	*pSceneNode = new aiNode;
	(*pSceneNode)->mName = pNodeElement.ID;
	// read mesh and color
	for(const CAMFImporter_NodeElement* ne_child: pNodeElement.Child)
	{
		std::vector<aiVector3D> vertex_arr;
		std::vector<CAMFImporter_NodeElement_Color*> color_arr;

		// color for object
		if(ne_child->Type == CAMFImporter_NodeElement::ENET_Color) object_color = (CAMFImporter_NodeElement_Color*)ne_child;

		if(ne_child->Type == CAMFImporter_NodeElement::ENET_Mesh)
		{
			// Create arrays from children of mesh: vertices.
			PostprocessHelper_CreateMeshDataArray(*((CAMFImporter_NodeElement_Mesh*)ne_child), vertex_arr, color_arr);
			// Use this arrays as a source when creating every aiMesh
			Postprocess_BuildMeshSet(*((CAMFImporter_NodeElement_Mesh*)ne_child), vertex_arr, color_arr, object_color, pMeshList, **pSceneNode);
		}
	}// for(const CAMFImporter_NodeElement* ne_child: pNodeElement)
}